

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_info.c
# Opt level: O2

void amd_l_info(c_float *Info)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  _func_int_char_ptr_varargs *p_Var7;
  char *pcVar8;
  double local_48;
  
  if (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0) {
    (*SuiteSparse_config.printf_func)("\nAMD version %d.%d.%d, %s, results:\n",2,4,6,"May 4, 2016");
  }
  if (Info == (c_float *)0x0) {
    return;
  }
  dVar1 = Info[1];
  dVar2 = Info[9];
  if (0.0 <= dVar2 && 0.0 <= dVar1) {
    local_48 = dVar1 + dVar2;
  }
  else {
    local_48 = -1.0;
  }
  dVar3 = Info[10];
  dVar4 = Info[0xb];
  dVar5 = Info[0xc];
  if (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0) {
    (*SuiteSparse_config.printf_func)("    status: ");
  }
  dVar6 = *Info;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    if ((dVar6 != -1.0) || (NAN(dVar6))) {
      if ((dVar6 != -2.0) || (NAN(dVar6))) {
        if ((dVar6 != 1.0) || (NAN(dVar6))) {
          if (SuiteSparse_config.printf_func == (_func_int_char_ptr_varargs *)0x0)
          goto LAB_0010c6d9;
          pcVar8 = "unknown\n";
        }
        else {
          if (SuiteSparse_config.printf_func == (_func_int_char_ptr_varargs *)0x0)
          goto LAB_0010c6d9;
          pcVar8 = "OK, but jumbled\n";
        }
      }
      else {
        if (SuiteSparse_config.printf_func == (_func_int_char_ptr_varargs *)0x0) goto LAB_0010c6d9;
        pcVar8 = "invalid matrix\n";
      }
    }
    else {
      if (SuiteSparse_config.printf_func == (_func_int_char_ptr_varargs *)0x0) goto LAB_0010c6d9;
      pcVar8 = "out of memory\n";
    }
  }
  else {
    if (SuiteSparse_config.printf_func == (_func_int_char_ptr_varargs *)0x0) goto LAB_0010c6d9;
    pcVar8 = "OK\n";
  }
  (*SuiteSparse_config.printf_func)(pcVar8);
LAB_0010c6d9:
  if (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0 && 0.0 <= dVar1) {
    (*SuiteSparse_config.printf_func)
              ("    n, dimension of A:                                  %.20g\n");
  }
  if (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0 && 0.0 <= Info[2]) {
    (*SuiteSparse_config.printf_func)
              ("    nz, number of nonzeros in A:                        %.20g\n");
  }
  if (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0 && 0.0 <= Info[3]) {
    (*SuiteSparse_config.printf_func)
              ("    symmetry of A:                                      %.4f\n");
  }
  if ((0.0 <= Info[4]) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0)) {
    (*SuiteSparse_config.printf_func)
              ("    number of nonzeros on diagonal:                     %.20g\n");
  }
  if ((0.0 <= Info[5]) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0)) {
    (*SuiteSparse_config.printf_func)
              ("    nonzeros in pattern of A+A\' (excl. diagonal):       %.20g\n");
  }
  if ((0.0 <= Info[6]) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0)) {
    (*SuiteSparse_config.printf_func)
              ("    # dense rows/columns of A+A\':                       %.20g\n");
  }
  if ((0.0 <= Info[7]) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0)) {
    (*SuiteSparse_config.printf_func)
              ("    memory used, in bytes:                              %.20g\n");
  }
  if ((0.0 <= Info[8]) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0)) {
    (*SuiteSparse_config.printf_func)
              ("    # of memory compactions:                            %.20g\n");
  }
  if (SuiteSparse_config.printf_func == (_func_int_char_ptr_varargs *)0x0) {
    p_Var7 = (_func_int_char_ptr_varargs *)0x0;
  }
  else {
    (*SuiteSparse_config.printf_func)
              (
              "\n    The following approximate statistics are for a subsequent\n    factorization of A(P,P) + A(P,P)\'.  They are slight upper\n    bounds if there are no dense rows/columns in A+A\', and become\n    looser if dense rows/columns exist.\n\n"
              );
    if (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0 && 0.0 <= dVar2) {
      (*SuiteSparse_config.printf_func)
                ("    nonzeros in L (excluding diagonal):                 %.20g\n",dVar2);
    }
    if (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0 && 0.0 <= local_48) {
      (*SuiteSparse_config.printf_func)
                ("    nonzeros in L (including diagonal):                 %.20g\n");
    }
    if (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0 && 0.0 <= dVar3) {
      (*SuiteSparse_config.printf_func)
                ("    # divide operations for LDL\' or LU:                 %.20g\n");
    }
    if ((0.0 <= dVar4) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0)) {
      (*SuiteSparse_config.printf_func)
                ("    # multiply-subtract operations for LDL\':            %.20g\n",dVar4);
    }
    p_Var7 = SuiteSparse_config.printf_func;
    if ((0.0 <= dVar5) && (SuiteSparse_config.printf_func != (_func_int_char_ptr_varargs *)0x0)) {
      (*SuiteSparse_config.printf_func)
                ("    # multiply-subtract operations for LU:              %.20g\n",dVar5);
      p_Var7 = SuiteSparse_config.printf_func;
    }
  }
  if ((0.0 <= Info[0xd]) && (p_Var7 != (_func_int_char_ptr_varargs *)0x0)) {
    (*p_Var7)("    max nz. in any column of L (incl. diagonal):        %.20g\n");
    p_Var7 = SuiteSparse_config.printf_func;
  }
  if ((((0.0 <= dVar3 && 0.0 <= dVar4) && 0.0 <= dVar5) && (0.0 <= dVar1)) &&
     (p_Var7 != (_func_int_char_ptr_varargs *)0x0)) {
    (*p_Var7)("\n    chol flop count for real A, sqrt counted as 1 flop: %.20g\n    LDL\' flop count for real A:                         %.20g\n    LDL\' flop count for complex A:                      %.20g\n    LU flop count for real A (with no pivoting):        %.20g\n    LU flop count for complex A (with no pivoting):     %.20g\n\n"
              ,dVar1 + dVar3 + dVar4 + dVar4,dVar4 + dVar4 + dVar3,dVar4 * 8.0 + dVar3 * 9.0,
              dVar5 + dVar5 + dVar3,dVar5 * 8.0 + dVar3 * 9.0);
    return;
  }
  return;
}

Assistant:

GLOBAL void AMD_info
(
    c_float Info [ ]
)
{
    c_float n, ndiv, nmultsubs_ldl, nmultsubs_lu, lnz, lnzd ;

    SUITESPARSE_PRINTF (("\nAMD version %d.%d.%d, %s, results:\n",
	AMD_MAIN_VERSION, AMD_SUB_VERSION, AMD_SUBSUB_VERSION, AMD_DATE)) ;

    if (!Info)
    {
	return ;
    }

    n = Info [AMD_N] ;
    ndiv = Info [AMD_NDIV] ;
    nmultsubs_ldl = Info [AMD_NMULTSUBS_LDL] ;
    nmultsubs_lu = Info [AMD_NMULTSUBS_LU] ;
    lnz = Info [AMD_LNZ] ;
    lnzd = (n >= 0 && lnz >= 0) ? (n + lnz) : (-1) ;

    /* AMD return status */
    SUITESPARSE_PRINTF (("    status: ")) ;
    if (Info [AMD_STATUS] == AMD_OK)
    {
	SUITESPARSE_PRINTF (("OK\n")) ;
    }
    else if (Info [AMD_STATUS] == AMD_OUT_OF_MEMORY)
    {
	SUITESPARSE_PRINTF (("out of memory\n")) ;
    }
    else if (Info [AMD_STATUS] == AMD_INVALID)
    {
	SUITESPARSE_PRINTF (("invalid matrix\n")) ;
    }
    else if (Info [AMD_STATUS] == AMD_OK_BUT_JUMBLED)
    {
	SUITESPARSE_PRINTF (("OK, but jumbled\n")) ;
    }
    else
    {
	SUITESPARSE_PRINTF (("unknown\n")) ;
    }

    /* statistics about the input matrix */
    PRI ("    n, dimension of A:                                  %.20g\n", n);
    PRI ("    nz, number of nonzeros in A:                        %.20g\n",
	Info [AMD_NZ]) ;
    PRI ("    symmetry of A:                                      %.4f\n",
	Info [AMD_SYMMETRY]) ;
    PRI ("    number of nonzeros on diagonal:                     %.20g\n",
	Info [AMD_NZDIAG]) ;
    PRI ("    nonzeros in pattern of A+A' (excl. diagonal):       %.20g\n",
	Info [AMD_NZ_A_PLUS_AT]) ;
    PRI ("    # dense rows/columns of A+A':                       %.20g\n",
	Info [AMD_NDENSE]) ;

    /* statistics about AMD's behavior  */
    PRI ("    memory used, in bytes:                              %.20g\n",
	Info [AMD_MEMORY]) ;
    PRI ("    # of memory compactions:                            %.20g\n",
	Info [AMD_NCMPA]) ;

    /* statistics about the ordering quality */
    SUITESPARSE_PRINTF (("\n"
	"    The following approximate statistics are for a subsequent\n"
	"    factorization of A(P,P) + A(P,P)'.  They are slight upper\n"
	"    bounds if there are no dense rows/columns in A+A', and become\n"
	"    looser if dense rows/columns exist.\n\n")) ;

    PRI ("    nonzeros in L (excluding diagonal):                 %.20g\n",
	lnz) ;
    PRI ("    nonzeros in L (including diagonal):                 %.20g\n",
	lnzd) ;
    PRI ("    # divide operations for LDL' or LU:                 %.20g\n",
	ndiv) ;
    PRI ("    # multiply-subtract operations for LDL':            %.20g\n",
	nmultsubs_ldl) ;
    PRI ("    # multiply-subtract operations for LU:              %.20g\n",
	nmultsubs_lu) ;
    PRI ("    max nz. in any column of L (incl. diagonal):        %.20g\n",
	Info [AMD_DMAX]) ;

    /* total flop counts for various factorizations */

    if (n >= 0 && ndiv >= 0 && nmultsubs_ldl >= 0 && nmultsubs_lu >= 0)
    {
	SUITESPARSE_PRINTF (("\n"
	"    chol flop count for real A, sqrt counted as 1 flop: %.20g\n"
	"    LDL' flop count for real A:                         %.20g\n"
	"    LDL' flop count for complex A:                      %.20g\n"
	"    LU flop count for real A (with no pivoting):        %.20g\n"
	"    LU flop count for complex A (with no pivoting):     %.20g\n\n",
	n + ndiv + 2*nmultsubs_ldl,
	    ndiv + 2*nmultsubs_ldl,
	  9*ndiv + 8*nmultsubs_ldl,
	    ndiv + 2*nmultsubs_lu,
	  9*ndiv + 8*nmultsubs_lu)) ;
    }
}